

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O0

ExpEmit __thiscall FxFloatCast::Emit(FxFloatCast *this,VMFunctionBuilder *build)

{
  uint uVar1;
  int iVar2;
  ExpEmit local_28;
  ExpEmit local_23;
  VMFunctionBuilder *pVStack_20;
  ExpEmit from;
  VMFunctionBuilder *build_local;
  FxFloatCast *this_local;
  ExpEmit to;
  
  pVStack_20 = build;
  uVar1 = (*this->basex->_vptr_FxExpression[7])(this->basex,build);
  local_23._0_2_ = SUB42(uVar1,0);
  local_23._2_1_ = SUB41(uVar1 >> 0x10,0);
  if ((uVar1 & 0x10000) != 0) {
    __assert_fail("!from.Konst",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                  ,0x297,"virtual ExpEmit FxFloatCast::Emit(VMFunctionBuilder *)");
  }
  iVar2 = (*(this->basex->ValueType->super_DObject)._vptr_DObject[0x12])();
  if (iVar2 == 0) {
    ExpEmit::Free(&local_23,pVStack_20);
    ExpEmit::ExpEmit((ExpEmit *)((long)&this_local + 5),pVStack_20,1);
    VMFunctionBuilder::Emit(pVStack_20,0x33,(uint)this_local._5_1_,(uint)local_23.RegNum,0);
    local_28._2_1_ = this_local._7_1_;
    local_28.RegNum = this_local._5_1_;
    local_28.RegType = this_local._6_1_;
    return local_28;
  }
  __assert_fail("basex->ValueType->GetRegType() == REGT_INT",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                ,0x298,"virtual ExpEmit FxFloatCast::Emit(VMFunctionBuilder *)");
}

Assistant:

ExpEmit FxFloatCast::Emit(VMFunctionBuilder *build)
{
	ExpEmit from = basex->Emit(build);
	assert(!from.Konst);
	assert(basex->ValueType->GetRegType() == REGT_INT);
	from.Free(build);
	ExpEmit to(build, REGT_FLOAT);
	build->Emit(OP_CAST, to.RegNum, from.RegNum, CAST_I2F);
	return to;
}